

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O1

string * __thiscall
glcts::DrawBuffersIndexedBlending::GenFS_abi_cxx11_
          (string *__return_storage_ptr__,DrawBuffersIndexedBlending *this,int maxDrawBuffers)

{
  ostream *poVar1;
  int iVar2;
  ostringstream os;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "#version 300 es                        \nprecision highp float;                 \nprecision highp int;                   \n"
             ,0x78);
  if (0 < maxDrawBuffers) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\nlayout(location = ",0x13);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,") out vec4 color",0x10);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
      iVar2 = iVar2 + 1;
    } while (maxDrawBuffers != iVar2);
  }
  if (0 < maxDrawBuffers) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\nuniform vec4 c",0xf);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
      iVar2 = iVar2 + 1;
    } while (maxDrawBuffers != iVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nvoid main() {",0xe);
  if (0 < maxDrawBuffers) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n    color",10);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = c",4);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";",1);
      iVar2 = iVar2 + 1;
    } while (maxDrawBuffers != iVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n}",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string DrawBuffersIndexedBlending::GenFS(int maxDrawBuffers)
{
	std::ostringstream os;
	os << "#version 300 es                        \n"
		  "precision highp float;                 \n"
		  "precision highp int;                   \n";

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		os << "\nlayout(location = " << i << ") out vec4 color" << i << ";";
	}
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		os << "\nuniform vec4 c" << i << ";";
	}

	os << "\nvoid main() {";

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		os << "\n    color" << i << " = c" << i << ";";
	}

	os << "\n}";
	return os.str();
}